

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O1

void si9ma::Trie::delete_str(TrieNode *root,string *str)

{
  char *pcVar1;
  TrieNode *pTVar2;
  ulong uVar3;
  TrieNode *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = str->_M_string_length;
  bVar8 = uVar7 != 0;
  pTVar4 = root;
  if (bVar8) {
    pcVar1 = (str->_M_dataplus)._M_p;
    pTVar2 = *(TrieNode **)((long)root + (long)*pcVar1 * 8 + -0x300);
    if (pTVar2 == (TrieNode *)0x0) {
      bVar8 = true;
    }
    else {
      uVar3 = 1;
      do {
        uVar6 = uVar3;
        pTVar4 = pTVar2;
        if (uVar7 == uVar6) break;
        pTVar2 = *(TrieNode **)((long)pTVar4 + (long)pcVar1[uVar6] * 8 + -0x300);
        uVar3 = uVar6 + 1;
      } while (pTVar2 != (TrieNode *)0x0);
      bVar8 = uVar6 < uVar7;
    }
  }
  if ((!bVar8) && (0 < pTVar4->end)) {
    root->pass = root->pass + -1;
    if (str->_M_string_length != 0) {
      uVar7 = 0;
      pTVar4 = root;
      do {
        lVar5 = (long)(str->_M_dataplus)._M_p[uVar7];
        root = *(TrieNode **)((long)pTVar4 + lVar5 * 8 + -0x300);
        root->pass = root->pass + -1;
        if (root->pass == 0) {
          *(undefined8 *)((long)pTVar4 + lVar5 * 8 + -0x300) = 0;
        }
        if (pTVar4->pass == 0) {
          TrieNode::~TrieNode(pTVar4);
          operator_delete(pTVar4);
        }
        uVar7 = uVar7 + 1;
        pTVar4 = root;
      } while (uVar7 < str->_M_string_length);
    }
    root->end = root->end + -1;
    if (root->pass == 0) {
      TrieNode::~TrieNode(root);
      operator_delete(root);
      return;
    }
  }
  return;
}

Assistant:

void Trie::delete_str(TrieNode *root,const string &str) {
        if (search(root,str) > 0) {
            root->pass--;
            auto *cur = root;
            auto *next = root;

            for (int i = 0; i < str.length(); ++i) {
                int index = str[i] - 'a';

                next = cur->nexts[index];

                // if next pass == 0,reset cur next ptr to null
                if (--cur->nexts[index]->pass == 0)
                    cur->nexts[index] = nullptr;

                // delete cur,if pass == 0
                if (cur->pass == 0)
                    delete cur;

                cur = next;
            }

            cur->end--;

            // delete last is pass == null
            if (cur->pass == 0)
                delete cur;
        }
    }